

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

bool __thiscall SchemeFloat::is_eq(SchemeFloat *this,shared_ptr<SchemeObject> *a)

{
  double dVar1;
  bool bVar2;
  element_type *peVar3;
  bool local_29;
  undefined1 local_28 [8];
  shared_ptr<SchemeFloat> p;
  shared_ptr<SchemeObject> *a_local;
  SchemeFloat *this_local;
  
  p.super___shared_ptr<SchemeFloat,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a;
  std::dynamic_pointer_cast<SchemeFloat,SchemeObject>((shared_ptr<SchemeObject> *)local_28);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  local_29 = false;
  if (bVar2) {
    dVar1 = this->value;
    peVar3 = std::__shared_ptr_access<SchemeFloat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemeFloat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    local_29 = dVar1 == peVar3->value;
  }
  std::shared_ptr<SchemeFloat>::~shared_ptr((shared_ptr<SchemeFloat> *)local_28);
  return local_29;
}

Assistant:

bool SchemeFloat::is_eq(const std::shared_ptr<SchemeObject> &a) const
{
    auto p = std::dynamic_pointer_cast<SchemeFloat>(a);
    return p && value == p->value;
}